

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_terminal.cpp
# Opt level: O0

void __thiscall ImportBool_True_Test::~ImportBool_True_Test(ImportBool_True_Test *this)

{
  ImportBool_True_Test *this_local;
  
  ~ImportBool_True_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (ImportBool, True) {
    bool v = false;
    auto parser = make_json_bool_parser (&v);
    parser.input ("true");
    parser.eof ();

    // Check the result.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_EQ (v, true);
}